

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform.h
# Opt level: O0

void ncnn::conv3x3s1_winograd63_transform_output_sse
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float tmp135c_1;
  float tmp024c_1;
  float tmp135b_1;
  float tmp024b_1;
  float tmp135a_1;
  float tmp024a_1;
  float *tmp0;
  int m_3;
  float *output0;
  float tmp135c;
  float tmp024c;
  float tmp135b;
  float tmp024b;
  float tmp135a;
  float tmp024a;
  int m_2;
  float *output0_tm_7;
  float *output0_tm_6;
  float *output0_tm_5;
  float *output0_tm_4;
  float *output0_tm_3;
  float *output0_tm_2;
  float *output0_tm_1;
  float *output0_tm_0;
  int j;
  int i;
  float tmp [6] [8];
  float bias0;
  Mat out0;
  Mat out0_tm;
  int p;
  float *biasptr;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outch;
  int outh;
  int outw;
  Mat *m_1;
  Mat *m;
  float local_414;
  int local_3bc;
  float *local_3b8;
  int local_394;
  float *local_390;
  float *local_388;
  float *local_380;
  float *local_378;
  float *local_370;
  float *local_368;
  float *local_360;
  float *local_358;
  int local_350;
  int local_34c;
  float local_348 [52];
  long local_278;
  undefined8 local_270;
  int local_1e4;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar14 = in_RSI[7];
  iVar15 = iVar1 / 6;
  iVar16 = (int)in_RSI[6] / 6;
  iVar17 = iVar15 * iVar16;
  lVar3 = *in_RDX;
  for (local_1e4 = 0; local_1e4 < (int)lVar14; local_1e4 = local_1e4 + 1) {
    lVar4 = *in_RDI;
    lVar5 = in_RDI[8];
    lVar6 = in_RDI[2];
    iVar2 = *(int *)((long)in_RSI + 0x2c);
    local_278 = *in_RSI + in_RSI[8] * (long)local_1e4 * in_RSI[2];
    lVar7 = in_RSI[2];
    local_270 = 0;
    if (lVar3 == 0) {
      local_414 = 0.0;
    }
    else {
      local_414 = *(float *)(lVar3 + (long)local_1e4 * 4);
    }
    for (local_34c = 0; local_34c < iVar16; local_34c = local_34c + 1) {
      for (local_350 = 0; local_350 < iVar15; local_350 = local_350 + 1) {
        local_358 = (float *)(lVar4 + lVar5 * local_1e4 * lVar6 +
                             (long)(local_34c * iVar15 + local_350) * 4);
        local_360 = local_358 + iVar17;
        local_368 = local_358 + iVar17 * 2;
        local_370 = local_358 + iVar17 * 3;
        local_378 = local_358 + iVar17 * 4;
        local_380 = local_358 + iVar17 * 5;
        local_388 = local_358 + iVar17 * 6;
        local_390 = local_358 + iVar17 * 7;
        for (local_394 = 0; local_394 < 8; local_394 = local_394 + 1) {
          fVar8 = *local_360 + *local_368;
          fVar11 = *local_360 - *local_368;
          fVar9 = *local_370 + *local_378;
          fVar12 = *local_370 - *local_378;
          fVar10 = *local_380 + *local_388;
          fVar13 = *local_380 - *local_388;
          local_348[local_394] = *local_358 + fVar8 + fVar9 + fVar10 * 32.0;
          local_348[(long)local_394 + 0x10] = fVar8 + fVar9 * 4.0 + fVar10 * 8.0;
          local_348[(long)local_394 + 0x20] = fVar8 + fVar9 * 16.0 + fVar10 + fVar10;
          local_348[(long)local_394 + 8] = fVar11 + fVar12 + fVar12 + fVar13 * 16.0;
          local_348[(long)local_394 + 0x18] = fVar11 + fVar12 * 8.0 + fVar13 * 4.0;
          local_348[(long)local_394 + 0x28] = *local_390 + fVar11 + fVar12 * 32.0 + fVar13;
          local_358 = local_358 + iVar17 * 8;
          local_360 = local_360 + iVar17 * 8;
          local_368 = local_368 + iVar17 * 8;
          local_370 = local_370 + iVar17 * 8;
          local_378 = local_378 + iVar17 * 8;
          local_380 = local_380 + iVar17 * 8;
          local_388 = local_388 + iVar17 * 8;
          local_390 = local_390 + iVar17 * 8;
        }
        local_3b8 = (float *)(local_278 + (long)iVar2 * (long)(local_34c * 6) * lVar7 +
                             (long)(local_350 * 6) * 4);
        for (local_3bc = 0; local_3bc < 6; local_3bc = local_3bc + 1) {
          lVar18 = (long)local_3bc;
          fVar8 = local_348[lVar18 * 8 + 1] + local_348[lVar18 * 8 + 2];
          fVar11 = local_348[lVar18 * 8 + 1] - local_348[lVar18 * 8 + 2];
          fVar9 = local_348[lVar18 * 8 + 3] + local_348[lVar18 * 8 + 4];
          fVar12 = local_348[lVar18 * 8 + 3] - local_348[lVar18 * 8 + 4];
          fVar10 = local_348[lVar18 * 8 + 5] + local_348[lVar18 * 8 + 6];
          fVar13 = local_348[lVar18 * 8 + 5] - local_348[lVar18 * 8 + 6];
          *local_3b8 = local_414 + local_348[lVar18 * 8] + fVar8 + fVar9 + fVar10 * 32.0;
          local_3b8[2] = local_414 + fVar8 + fVar9 * 4.0 + fVar10 * 8.0;
          local_3b8[4] = local_414 + fVar8 + fVar9 * 16.0 + fVar10 + fVar10;
          local_3b8[1] = local_414 + fVar11 + fVar12 + fVar12 + fVar13 * 16.0;
          local_3b8[3] = local_414 + fVar11 + fVar12 * 8.0 + fVar13 * 4.0;
          local_3b8[5] = local_414 + local_348[lVar18 * 8 + 7] + fVar11 + fVar12 * 32.0 + fVar13;
          local_3b8 = local_3b8 + iVar1;
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_output_sse(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 6;
    const int h_tiles = outh / 6;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[6][8] = {
    //     {1.0f,  1.0f,   1.0f,   1.0f,   1.0f,  32.0f, 32.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   2.0f,  -2.0f,  16.0f,-16.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,   4.0f,   4.0f,   8.0f,  8.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   8.0f,  -8.0f,   4.0f, -4.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,  16.0f,  16.0f,   2.0f,  2.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,  32.0f, -32.0f,   1.0f, -1.0f, 1.0f}
    // };

    // 0 = r0 + (r1 + r2) + (r3 + r4)     + (r5 + r6) * 32
    // 1 =      (r1 - r2) + (r3 - r4) * 2 + (r5 - r6) * 16
    // 2 =      (r1 + r2) + (r3 + r4) * 4 + (r5 + r6) * 8
    // 3 =      (r1 - r2) + (r3 - r4) * 8 + (r5 - r6) * 4
    // 4 =      (r1 + r2) + (r3 + r4) * 16+ (r5 + r6) * 2
    // 5 = r7 + (r1 - r2) + (r3 - r4) * 32+ (r5 - r6)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        const float bias0 = biasptr ? biasptr[p] : 0.f;

        float tmp[6][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j) * 1;
                const float* output0_tm_1 = output0_tm_0 + tiles * 1;
                const float* output0_tm_2 = output0_tm_0 + tiles * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 3;
                const float* output0_tm_4 = output0_tm_0 + tiles * 4;
                const float* output0_tm_5 = output0_tm_0 + tiles * 5;
                const float* output0_tm_6 = output0_tm_0 + tiles * 6;
                const float* output0_tm_7 = output0_tm_0 + tiles * 7;

                // TODO sse optimize
                for (int m = 0; m < 8; m++)
                {
                    float tmp024a = output0_tm_1[0] + output0_tm_2[0];
                    float tmp135a = output0_tm_1[0] - output0_tm_2[0];

                    float tmp024b = output0_tm_3[0] + output0_tm_4[0];
                    float tmp135b = output0_tm_3[0] - output0_tm_4[0];

                    float tmp024c = output0_tm_5[0] + output0_tm_6[0];
                    float tmp135c = output0_tm_5[0] - output0_tm_6[0];

                    tmp[0][m] = output0_tm_0[0] + tmp024a + tmp024b + tmp024c * 32;
                    tmp[2][m] = tmp024a + tmp024b * 4 + tmp024c * 8;
                    tmp[4][m] = tmp024a + tmp024b * 16 + tmp024c + tmp024c;

                    tmp[1][m] = tmp135a + tmp135b + tmp135b + tmp135c * 16;
                    tmp[3][m] = tmp135a + tmp135b * 8 + tmp135c * 4;
                    tmp[5][m] = output0_tm_7[0] + tmp135a + tmp135b * 32 + tmp135c;

                    output0_tm_0 += tiles * 8;
                    output0_tm_1 += tiles * 8;
                    output0_tm_2 += tiles * 8;
                    output0_tm_3 += tiles * 8;
                    output0_tm_4 += tiles * 8;
                    output0_tm_5 += tiles * 8;
                    output0_tm_6 += tiles * 8;
                    output0_tm_7 += tiles * 8;
                }

                float* output0 = out0.row(i * 6) + j * 6;

                for (int m = 0; m < 6; m++)
                {
                    const float* tmp0 = tmp[m];

                    float tmp024a = tmp0[1] + tmp0[2];
                    float tmp135a = tmp0[1] - tmp0[2];

                    float tmp024b = tmp0[3] + tmp0[4];
                    float tmp135b = tmp0[3] - tmp0[4];

                    float tmp024c = tmp0[5] + tmp0[6];
                    float tmp135c = tmp0[5] - tmp0[6];

                    output0[0] = bias0 + tmp0[0] + tmp024a + tmp024b + tmp024c * 32;
                    output0[2] = bias0 + tmp024a + tmp024b * 4 + tmp024c * 8;
                    output0[4] = bias0 + tmp024a + tmp024b * 16 + tmp024c + tmp024c;

                    output0[1] = bias0 + tmp135a + tmp135b + tmp135b + tmp135c * 16;
                    output0[3] = bias0 + tmp135a + tmp135b * 8 + tmp135c * 4;
                    output0[5] = bias0 + tmp0[7] + tmp135a + tmp135b * 32 + tmp135c;

                    output0 += outw;
                }
            }
        }
    }
}